

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

const_iterator __thiscall Disa::Matrix_Sparse::end(Matrix_Sparse *this)

{
  pointer puVar1;
  pointer puVar2;
  size_t i_row;
  value_type local_10;
  
  puVar1 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  i_row = 0;
  if (puVar1 != puVar2) {
    i_row = ((long)puVar1 - (long)puVar2 >> 3) - 1;
  }
  Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Row
            ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_10,i_row,this);
  return (const_iterator)local_10;
}

Assistant:

Matrix_Sparse::const_iterator Matrix_Sparse::end() const noexcept {
  return {size_row(), this};
}